

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# input.cpp
# Opt level: O1

bool __thiscall ftxui::WideInputBase::OnMouseEvent(WideInputBase *this,Event *event)

{
  wstring *pwVar1;
  _Any_data *p_Var2;
  bool bVar3;
  _func_int **in_RAX;
  Ref<int> *pRVar4;
  int iVar5;
  InputOption *pIVar6;
  Ref<int> *pRVar7;
  wstring *pwVar8;
  pointer *__ptr;
  _Any_data *p_Var9;
  int iVar10;
  _func_int **local_28;
  
  local_28 = in_RAX;
  ComponentBase::CaptureMouse((ComponentBase *)&local_28,(Event *)this);
  if (local_28 != (_func_int **)0x0) {
    (**(code **)(*local_28 + 8))(local_28);
    bVar3 = Box::Contain(&this->input_box_,(event->field_1).mouse_.x,(event->field_1).mouse_.y);
    if (bVar3) {
      ComponentBase::TakeFocus(&this->super_ComponentBase);
      if ((event->field_1).mouse_.button != Left) {
        return true;
      }
      if ((event->field_1).mouse_.motion != Pressed) {
        return true;
      }
      pIVar6 = (this->option_).address_;
      if (pIVar6 == (InputOption *)0x0) {
        pIVar6 = &(this->option_).owned_;
      }
      pRVar4 = (Ref<int> *)(pIVar6->cursor_position).address_;
      pRVar7 = &pIVar6->cursor_position;
      if (pRVar4 != (Ref<int> *)0x0) {
        pRVar7 = pRVar4;
      }
      pwVar1 = (this->content_).address_;
      pRVar4 = (Ref<int> *)&this->cursor_position_internal_;
      if (pRVar7->owned_ != -1) {
        pRVar4 = pRVar7;
      }
      iVar10 = ((event->field_1).mouse_.x + pRVar4->owned_) - (this->cursor_box_).x_min;
      pwVar8 = &(this->content_).owned_;
      if (pwVar1 != (wstring *)0x0) {
        pwVar8 = pwVar1;
      }
      iVar5 = (int)pwVar8->_M_string_length;
      if (iVar5 <= iVar10) {
        iVar10 = iVar5;
      }
      iVar5 = 0;
      if (0 < iVar10) {
        iVar5 = iVar10;
      }
      if (pRVar4->owned_ == iVar5) {
        return true;
      }
      pRVar4->owned_ = iVar5;
      p_Var2 = (_Any_data *)(this->option_).address_;
      p_Var9 = (_Any_data *)&this->option_;
      if (p_Var2 != (_Any_data *)0x0) {
        p_Var9 = p_Var2;
      }
      if (*(long *)(p_Var9 + 1) != 0) {
        (**(code **)((long)p_Var9 + 0x18))(p_Var9);
        return true;
      }
      std::__throw_bad_function_call();
    }
  }
  return false;
}

Assistant:

bool OnMouseEvent(Event event) {
    if (!CaptureMouse(event))
      return false;
    if (!input_box_.Contain(event.mouse().x, event.mouse().y))
      return false;

    TakeFocus();

    if (event.mouse().button == Mouse::Left &&
        event.mouse().motion == Mouse::Pressed) {
      int new_cursor_position =
          cursor_position() + event.mouse().x - cursor_box_.x_min;
      new_cursor_position =
          std::max(0, std::min<int>(content_->size(), new_cursor_position));
      if (cursor_position() != new_cursor_position) {
        cursor_position() = new_cursor_position;
        option_->on_change();
      }
    }
    return true;
  }